

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O0

void PixelToaster::convert_XRGB8888_to_XBGR1555(integer32 *source,integer16 *destination,uint count)

{
  integer32 b;
  integer32 g;
  integer32 r;
  uint i;
  uint count_local;
  integer16 *destination_local;
  integer32 *source_local;
  
  for (g = 0; g < count; g = g + 1) {
    destination[g] =
         ((ushort)(source[g] >> 0x10) & 0xf8) >> 3 | (ushort)((source[g] & 0xf800) >> 6) |
         (ushort)((source[g] & 0xf8) << 7);
  }
  return;
}

Assistant:

inline void convert_XRGB8888_to_XBGR1555(const integer32 source[], integer16 destination[], unsigned int count)
{
    for (unsigned int i = 0; i < count; ++i)
    {
        integer32 r = (source[i] & 0x00F80000) >> 19;
        integer32 g = (source[i] & 0x0000F800) >> 6;
        integer32 b = (source[i] & 0x000000F8) << 7;

        destination[i] = (integer16)(r | g | b);
    }
}